

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall ftxui::Renderer::Impl::~Impl(Impl *this)

{
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__Impl_00168650;
  std::_Function_base::~_Function_base
            ((_Function_base *)&(this->render_).super__Function_base._M_manager);
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

Component Renderer(std::function<Element(bool)> render) {
  class Impl : public ComponentBase {
   public:
    Impl(std::function<Element(bool)> render) : render_(std::move(render)) {}

   private:
    Element Render() override { return render_(Focused()) | reflect(box_); }
    bool Focusable() const override { return true; }
    bool OnEvent(Event event) override {
      if (event.is_mouse() && box_.Contain(event.mouse().x, event.mouse().y)) {
        if (!CaptureMouse(event))
          return false;

        TakeFocus();
      }

      return false;
    }
    Box box_;

    std::function<Element(bool)> render_;
  };
  return Make<Impl>(std::move(render));
}